

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O1

void save0(char *filename)

{
  ofstream out_file;
  Am_Value local_218;
  undefined1 local_208 [32];
  byte abStack_1e8 [216];
  ios_base local_110 [264];
  
  std::ofstream::ofstream(local_208,filename,_S_out);
  if ((abStack_1e8[*(long *)(local_208._0_8_ + -0x18)] & 5) == 0) {
    Am_Load_Save_Context::Reset();
    local_218.type = 2;
    local_218.value.long_value = 5;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 3;
    local_218.value.wrapper_value = (Am_Wrapper *)0x44fc16;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 4;
    local_218.value.bool_value = true;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 4;
    local_218.value.long_value = (ulong)(uint7)local_218.value.long_value._1_7_ << 8;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 5;
    local_218.value.float_value = 54.234;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
    Am_Value::Am_Value(&local_218,123.344);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 7;
    local_218.value.long_value = 0x61;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
    Am_Value::Am_Value(&local_218,"Hello this is a test to see what\n happens");
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_218);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open failed",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  local_208._0_8_ = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18)) = _Am_Red;
  std::filebuf::~filebuf((filebuf *)(local_208 + 8));
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void
save0(const char *filename)
{
  // create file for output
  std::ofstream out_file(filename, std::ios::out);
  if (!out_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // write some plain data objects to the stream
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(5));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value((long)4520982));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(true));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(false));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value((float)54.234));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(123.344));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value('a'));
  Am_Default_Load_Save_Context.Save(
      out_file, Am_Value("Hello this is a test to see what\n happens"));

  return;
}